

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

void plutovg_matrix_multiply
               (plutovg_matrix_t *matrix,plutovg_matrix_t *left,plutovg_matrix_t *right)

{
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  plutovg_matrix_t *right_local;
  plutovg_matrix_t *left_local;
  plutovg_matrix_t *matrix_local;
  
  plutovg_matrix_init(matrix,left->a * right->a + left->b * right->c,
                      left->a * right->b + left->b * right->d,
                      left->c * right->a + left->d * right->c,
                      left->c * right->b + left->d * right->d,
                      left->e * right->a + left->f * right->c + right->e,
                      left->e * right->b + left->f * right->d + right->f);
  return;
}

Assistant:

void plutovg_matrix_multiply(plutovg_matrix_t* matrix, const plutovg_matrix_t* left, const plutovg_matrix_t* right)
{
    float a = left->a * right->a + left->b * right->c;
    float b = left->a * right->b + left->b * right->d;
    float c = left->c * right->a + left->d * right->c;
    float d = left->c * right->b + left->d * right->d;
    float e = left->e * right->a + left->f * right->c + right->e;
    float f = left->e * right->b + left->f * right->d + right->f;
    plutovg_matrix_init(matrix, a, b, c, d, e, f);
}